

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O2

string * regex_escape(string *__return_storage_ptr__,string *s)

{
  int iVar1;
  
  if (regex_escape(std::__cxx11::string_const&)::special_chars_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&regex_escape(std::__cxx11::string_const&)::special_chars_abi_cxx11_
                               );
    if (iVar1 != 0) {
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
                (&regex_escape(std::__cxx11::string_const&)::special_chars_abi_cxx11_,
                 "[.^$|()*+?\\[\\]{}\\\\]",0x10);
      __cxa_atexit(std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex,
                   &regex_escape(std::__cxx11::string_const&)::special_chars_abi_cxx11_,
                   &__dso_handle);
      __cxa_guard_release(&regex_escape(std::__cxx11::string_const&)::special_chars_abi_cxx11_);
    }
  }
  std::
  regex_replace<std::__cxx11::regex_traits<char>,char,std::char_traits<char>,std::allocator<char>>
            (__return_storage_ptr__,s,
             &regex_escape(std::__cxx11::string_const&)::special_chars_abi_cxx11_,"\\$0",0);
  return __return_storage_ptr__;
}

Assistant:

std::string regex_escape(const std::string & s) {
    static const std::regex special_chars("[.^$|()*+?\\[\\]{}\\\\]");
    return std::regex_replace(s, special_chars, "\\$0");
}